

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_util.c
# Opt level: O0

CMimeInfo_T * cmime_util_info_new(void)

{
  CMimeInfo_T *pCVar1;
  CMimeInfo_T *mi;
  
  pCVar1 = (CMimeInfo_T *)calloc(1,0x18);
  pCVar1->mime_type = (char *)0x0;
  pCVar1->mime_encoding = (char *)0x0;
  pCVar1->combined = (char *)0x0;
  return pCVar1;
}

Assistant:

CMimeInfo_T *cmime_util_info_new(void) {
    CMimeInfo_T *mi = NULL;
    mi = (CMimeInfo_T *)calloc((size_t)1,sizeof(CMimeInfo_T));
    mi->mime_type =  NULL;
    mi->mime_encoding = NULL;
    mi->combined = NULL;
    return(mi);
}